

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O0

int Mecab_clear(Mecab *m)

{
  long in_RDI;
  Model *model;
  Tagger *tagger;
  Lattice *lattice;
  Mecab *in_stack_ffffffffffffffd0;
  
  Mecab_refresh(in_stack_ffffffffffffffd0);
  if (*(long *)(in_RDI + 0x20) != 0) {
    if (*(long **)(in_RDI + 0x20) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x20) + 0x138))();
    }
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  if (*(long *)(in_RDI + 0x18) != 0) {
    if (*(long **)(in_RDI + 0x18) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x18) + 0xe8))();
    }
    *(undefined8 *)(in_RDI + 0x18) = 0;
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    if (*(long **)(in_RDI + 0x10) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x10) + 0x38))();
    }
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  return 1;
}

Assistant:

BOOL Mecab_clear(Mecab *m)
{
   Mecab_refresh(m);

   if(m->lattice) {
      MeCab::Lattice *lattice = (MeCab::Lattice *) m->lattice;
      delete lattice;
      m->lattice = NULL;
   }

   if(m->tagger) {
      MeCab::Tagger *tagger = (MeCab::Tagger *) m->tagger;
      delete tagger;
      m->tagger = NULL;
   }

   if(m->model) {
      MeCab::Model *model = (MeCab::Model *) m->model;
      delete model;
      m->model = NULL;
   }

   return TRUE;
}